

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::InputFile::InputFile(InputFile *this,InputPartData *part)

{
  Data *this_00;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile = (_func_int **)&PTR__InputFile_0300c730;
  this_00 = (Data *)operator_new(0x108);
  Data::Data(this_00,part->numThreads);
  this->_data = this_00;
  this_00->_deleteStream = false;
  multiPartInitialize(this,part);
  return;
}

Assistant:

InputFile::InputFile (InputPartData* part) :
    _data (new Data (part->numThreads))
{
    _data->_deleteStream=false;
    try
    {
       multiPartInitialize (part);
    }
    catch(...)
    {
        delete _data;
        throw;
    }
}